

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

lcp_t lcp(uchar *a,uchar *b)

{
  lcp_t lVar1;
  
  for (lVar1 = 0; (a[lVar1] != '\0' && (a[lVar1] == b[lVar1])); lVar1 = lVar1 + 1) {
  }
  return lVar1;
}

Assistant:

static lcp_t
lcp(unsigned char* a, unsigned char* b)
{
	size_t i=0;
	while (true) {
		const unsigned char A = *a++;
		const unsigned char B = *b++;
		if (A==0 or A != B) return i;
		++i;
	}
	assert(0);
	return lcp_t(-1);
}